

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

float dyy(qnode_ptr_t q,int x,int y,int z)

{
  param512_t *papVar1;
  float *pfVar2;
  int *piVar3;
  kernel_t *pkVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  
  iVar5 = C.m;
  iVar7 = (C.m - (C.m >> 0x1f) & 0xfffffffeU) + q->ofst;
  lVar6 = (long)(q->res * x + y);
  papVar1 = q->param_ptr[z];
  piVar3 = &(*papVar1)[lVar6].err;
  if ((((y < iVar7) || (x < iVar7)) || (q->sizy - iVar7 <= x)) || (q->sizx - iVar7 <= y)) {
    *piVar3 = 1;
    fVar8 = 0.0;
  }
  else {
    *piVar3 = 0;
    fVar8 = 0.0;
    if (-2 < iVar5) {
      iVar5 = iVar5 / 2;
      iVar7 = -iVar5;
      if (0 < iVar5) {
        iVar7 = iVar5;
      }
      iVar7 = iVar7 + iVar5 + 1;
      pfVar2 = (float *)((long)papVar1 + lVar6 * 0x30 + (long)iVar5 * -0x30 + 0x1c);
      pkVar4 = &C;
      do {
        fVar8 = fVar8 + *pfVar2 * pkVar4->k[0];
        pkVar4 = (kernel_t *)(pkVar4->k + 1);
        pfVar2 = pfVar2 + 0xc;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    fVar8 = fVar8 / C.f;
  }
  return fVar8;
}

Assistant:

float dyy(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*x + y+i].fy*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}